

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signingprovider.cpp
# Opt level: O0

bool __thiscall
FlatSigningProvider::GetTaprootSpendData
          (FlatSigningProvider *this,XOnlyPubKey *output_key,TaprootSpendData *spenddata)

{
  long lVar1;
  bool bVar2;
  TaprootSpendData *in_RDI;
  long in_FS_OFFSET;
  TaprootBuilder builder;
  TaprootSpendData *in_stack_fffffffffffffec8;
  undefined7 in_stack_fffffffffffffed0;
  undefined1 in_stack_fffffffffffffed7;
  map<XOnlyPubKey,_TaprootBuilder,_std::less<XOnlyPubKey>,_std::allocator<std::pair<const_XOnlyPubKey,_TaprootBuilder>_>_>
  *map;
  undefined7 in_stack_fffffffffffffee8;
  undefined1 in_stack_fffffffffffffeef;
  TaprootBuilder *in_stack_ffffffffffffff98;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  map = (map<XOnlyPubKey,_TaprootBuilder,_std::less<XOnlyPubKey>,_std::allocator<std::pair<const_XOnlyPubKey,_TaprootBuilder>_>_>
         *)&stack0xffffffffffffff90;
  TaprootBuilder::TaprootBuilder
            ((TaprootBuilder *)CONCAT17(in_stack_fffffffffffffeef,in_stack_fffffffffffffee8));
  bVar2 = LookupHelper<std::map<XOnlyPubKey,TaprootBuilder,std::less<XOnlyPubKey>,std::allocator<std::pair<XOnlyPubKey_const,TaprootBuilder>>>,XOnlyPubKey,TaprootBuilder>
                    (map,&in_RDI->internal_key,
                     (TaprootBuilder *)CONCAT17(in_stack_fffffffffffffed7,in_stack_fffffffffffffed0)
                    );
  if (bVar2) {
    TaprootBuilder::GetSpendData(in_stack_ffffffffffffff98);
    TaprootSpendData::operator=
              (in_RDI,(TaprootSpendData *)
                      CONCAT17(in_stack_fffffffffffffed7,in_stack_fffffffffffffed0));
    TaprootSpendData::~TaprootSpendData(in_stack_fffffffffffffec8);
  }
  TaprootBuilder::~TaprootBuilder((TaprootBuilder *)in_stack_fffffffffffffec8);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return bVar2;
}

Assistant:

bool FlatSigningProvider::GetTaprootSpendData(const XOnlyPubKey& output_key, TaprootSpendData& spenddata) const
{
    TaprootBuilder builder;
    if (LookupHelper(tr_trees, output_key, builder)) {
        spenddata = builder.GetSpendData();
        return true;
    }
    return false;
}